

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_strategy ZVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params params_01;
  ZSTD_CCtx_params params_02;
  U32 UVar13;
  U32 UVar14;
  U32 end;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  uint uVar18;
  ZSTD_CCtx_params *pZVar19;
  size_t *psVar20;
  ZSTD_format_e *pZVar21;
  size_t *psVar22;
  undefined8 *puVar23;
  ulong uVar24;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined8 in_stack_fffffffffffffec0;
  undefined1 auVar25 [12];
  undefined1 auVar26 [24];
  undefined1 in_stack_fffffffffffffec8 [112];
  undefined1 auVar27 [24];
  ZSTD_format_e local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  ZSTD_frameParameters local_98;
  int iStack_8c;
  int local_88;
  ZSTD_dictAttachPref_e local_84;
  size_t local_80 [10];
  
  if ((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) {
    pZVar19 = &params;
    puVar23 = (undefined8 *)&stack0xfffffffffffffeb8;
    for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
      *puVar23 = *(undefined8 *)pZVar19;
      pZVar19 = (ZSTD_CCtx_params *)&(pZVar19->cParams).chainLog;
      puVar23 = puVar23 + 1;
    }
    params_01.cParams.windowLog = in_stack_fffffffffffffebc;
    params_01.format = in_stack_fffffffffffffeb8;
    params_01.cParams.chainLog = (int)in_stack_fffffffffffffec0;
    params_01.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    auVar25 = in_stack_fffffffffffffec8._16_12_;
    auVar26 = in_stack_fffffffffffffec8._64_24_;
    auVar27 = in_stack_fffffffffffffec8._88_24_;
    params_01.cParams.searchLog = in_stack_fffffffffffffec8._0_4_;
    params_01.cParams.minMatch = in_stack_fffffffffffffec8._4_4_;
    params_01.cParams.targetLength = in_stack_fffffffffffffec8._8_4_;
    params_01.cParams.strategy = in_stack_fffffffffffffec8._12_4_;
    params_01.fParams.contentSizeFlag = auVar25._0_4_;
    params_01.fParams.checksumFlag = auVar25._4_4_;
    params_01.fParams.noDictIDFlag = auVar25._8_4_;
    params_01.compressionLevel = in_stack_fffffffffffffec8._28_4_;
    params_01.forceWindow = in_stack_fffffffffffffec8._32_4_;
    params_01.attachDictPref = in_stack_fffffffffffffec8._36_4_;
    params_01.nbWorkers = in_stack_fffffffffffffec8._40_4_;
    params_01._60_4_ = in_stack_fffffffffffffec8._44_4_;
    params_01.jobSize = in_stack_fffffffffffffec8._48_8_;
    params_01.overlapLog = in_stack_fffffffffffffec8._56_4_;
    params_01.rsyncable = in_stack_fffffffffffffec8._60_4_;
    params_01.ldmParams.enableLdm = auVar26._0_4_;
    params_01.ldmParams.hashLog = auVar26._4_4_;
    params_01.ldmParams.bucketSizeLog = auVar26._8_4_;
    params_01.ldmParams.minMatchLength = auVar26._12_4_;
    params_01.ldmParams.hashRateLog = auVar26._16_4_;
    params_01.ldmParams.windowLog = auVar26._20_4_;
    params_01.customMem.customAlloc = (ZSTD_allocFunction)auVar27._0_8_;
    params_01.customMem.customFree = (ZSTD_freeFunction)auVar27._8_8_;
    params_01.customMem.opaque = (void *)auVar27._16_8_;
    sVar16 = ZSTD_resetCCtx_internal(cctx,params_01,pledgedSrcSize,ZSTDcrp_continue,zbuff);
    if (0xffffffffffffff88 < sVar16) {
      return sVar16;
    }
    sVar16 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&params,dict,
                        dictSize,dictContentType,dtlm,cctx->entropyWorkspace);
    if (0xffffffffffffff88 < sVar16) {
      return sVar16;
    }
    cctx->dictID = (U32)sVar16;
  }
  else {
    ZVar1 = (cdict->matchState).cParams.strategy;
    local_b8 = params.format;
    uStack_b4 = params.cParams.windowLog;
    if ((params.forceWindow != 0 || params.attachDictPref == ZSTD_dictForceCopy) ||
        (params.attachDictPref != ZSTD_dictForceAttach && pledgedSrcSize != 0xffffffffffffffff) &&
        attachDictSizeCutoffs[ZVar1] < pledgedSrcSize) {
      local_98.contentSizeFlag = params.fParams.contentSizeFlag;
      local_98.checksumFlag = params.fParams.checksumFlag;
      local_98.noDictIDFlag = params.fParams.noDictIDFlag;
      iStack_8c = params.compressionLevel;
      uStack_a0._0_4_ = params.cParams.targetLength;
      uStack_a0._4_4_ = params.cParams.strategy;
      local_88 = params.forceWindow;
      local_84 = params.attachDictPref;
      psVar20 = (size_t *)&params.nbWorkers;
      psVar22 = local_80;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *psVar22 = *psVar20;
        psVar20 = psVar20 + 1;
        psVar22 = psVar22 + 1;
      }
      uVar7 = (cdict->matchState).cParams.chainLog;
      uVar8 = (cdict->matchState).cParams.hashLog;
      uVar9 = (cdict->matchState).cParams.searchLog;
      uVar10 = (cdict->matchState).cParams.minMatch;
      uStack_b0 = uVar7;
      uStack_ac = uVar8;
      local_a8 = uVar9;
      uStack_a4 = uVar10;
      uStack_a0._0_4_ = (cdict->matchState).cParams.targetLength;
      uStack_a0._4_4_ = (cdict->matchState).cParams.strategy;
      pZVar21 = &local_b8;
      puVar23 = (undefined8 *)&stack0xfffffffffffffeb8;
      for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar23 = *(undefined8 *)pZVar21;
        pZVar21 = pZVar21 + 2;
        puVar23 = puVar23 + 1;
      }
      params_00.cParams.windowLog = in_stack_fffffffffffffebc;
      params_00.format = in_stack_fffffffffffffeb8;
      params_00.cParams.chainLog = (int)in_stack_fffffffffffffec0;
      params_00.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
      auVar25 = in_stack_fffffffffffffec8._16_12_;
      auVar26 = in_stack_fffffffffffffec8._64_24_;
      auVar27 = in_stack_fffffffffffffec8._88_24_;
      params_00.cParams.searchLog = in_stack_fffffffffffffec8._0_4_;
      params_00.cParams.minMatch = in_stack_fffffffffffffec8._4_4_;
      params_00.cParams.targetLength = in_stack_fffffffffffffec8._8_4_;
      params_00.cParams.strategy = in_stack_fffffffffffffec8._12_4_;
      params_00.fParams.contentSizeFlag = auVar25._0_4_;
      params_00.fParams.checksumFlag = auVar25._4_4_;
      params_00.fParams.noDictIDFlag = auVar25._8_4_;
      params_00.compressionLevel = in_stack_fffffffffffffec8._28_4_;
      params_00.forceWindow = in_stack_fffffffffffffec8._32_4_;
      params_00.attachDictPref = in_stack_fffffffffffffec8._36_4_;
      params_00.nbWorkers = in_stack_fffffffffffffec8._40_4_;
      params_00._60_4_ = in_stack_fffffffffffffec8._44_4_;
      params_00.jobSize = in_stack_fffffffffffffec8._48_8_;
      params_00.overlapLog = in_stack_fffffffffffffec8._56_4_;
      params_00.rsyncable = in_stack_fffffffffffffec8._60_4_;
      params_00.ldmParams.enableLdm = auVar26._0_4_;
      params_00.ldmParams.hashLog = auVar26._4_4_;
      params_00.ldmParams.bucketSizeLog = auVar26._8_4_;
      params_00.ldmParams.minMatchLength = auVar26._12_4_;
      params_00.ldmParams.hashRateLog = auVar26._16_4_;
      params_00.ldmParams.windowLog = auVar26._20_4_;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar27._0_8_;
      params_00.customMem.customFree = (ZSTD_freeFunction)auVar27._8_8_;
      params_00.customMem.opaque = (void *)auVar27._16_8_;
      ZSTD_resetCCtx_internal(cctx,params_00,pledgedSrcSize,ZSTDcrp_noMemset,zbuff);
      if ((cdict->matchState).cParams.strategy == ZSTD_fast) {
        lVar17 = 0;
      }
      else {
        lVar17 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
             ((1L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f)) + lVar17) * 4);
      memset((cctx->blockState).matchState.hashTable3,0,
             4L << ((byte)(cctx->blockState).matchState.hashLog3 & 0x3f));
      pBVar11 = (cdict->matchState).window.base;
      pBVar12 = (cdict->matchState).window.dictBase;
      UVar13 = (cdict->matchState).window.dictLimit;
      UVar14 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.nextSrc = (cdict->matchState).window.nextSrc;
      (cctx->blockState).matchState.window.base = pBVar11;
      (cctx->blockState).matchState.window.dictBase = pBVar12;
      (cctx->blockState).matchState.window.dictLimit = UVar13;
      (cctx->blockState).matchState.window.lowLimit = UVar14;
      (cctx->blockState).matchState.nextToUpdate = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.nextToUpdate3 = (cdict->matchState).nextToUpdate3;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      cctx->dictID = cdict->dictID;
      memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
      return 0;
    }
    local_98.contentSizeFlag = params.fParams.contentSizeFlag;
    local_98.checksumFlag = params.fParams.checksumFlag;
    local_98.noDictIDFlag = params.fParams.noDictIDFlag;
    iStack_8c = params.compressionLevel;
    uStack_a0._0_4_ = params.cParams.targetLength;
    uStack_a0._4_4_ = params.cParams.strategy;
    local_88 = params.forceWindow;
    local_84 = params.attachDictPref;
    psVar20 = (size_t *)&params.nbWorkers;
    psVar22 = local_80;
    for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
      *psVar22 = *psVar20;
      psVar20 = psVar20 + 1;
      psVar22 = psVar22 + 1;
    }
    uVar15 = (cdict->matchState).cParams.windowLog;
    uVar2 = (cdict->matchState).cParams.chainLog;
    uVar3 = (cdict->matchState).cParams.hashLog;
    uVar24 = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
    uVar18 = uVar15;
    if (uVar24 < 0x40000000) {
      uVar18 = (int)uVar24 - 1;
      uVar6 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar18 = 6;
      if (0x3f < uVar24) {
        uVar18 = (uVar6 ^ 0xffffffe0) + 0x21;
      }
      if (uVar15 < uVar18) {
        uVar18 = uVar15;
      }
    }
    uStack_ac = uVar18 + 1;
    if (uVar3 < uVar18 + 1) {
      uStack_ac = uVar3;
    }
    uStack_b0 = (ZSTD_lazy2 < ZVar1) + uVar18;
    if (uVar2 - (ZSTD_lazy2 < ZVar1) <= uVar18) {
      uStack_b0 = uVar2;
    }
    uVar4 = (cdict->matchState).cParams.searchLog;
    uVar5 = (cdict->matchState).cParams.minMatch;
    local_a8 = uVar4;
    uStack_a4 = uVar5;
    uStack_a0 = CONCAT44(ZVar1,(cdict->matchState).cParams.targetLength);
    pZVar21 = &local_b8;
    puVar23 = (undefined8 *)&stack0xfffffffffffffeb8;
    for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
      *puVar23 = *(undefined8 *)pZVar21;
      pZVar21 = pZVar21 + 2;
      puVar23 = puVar23 + 1;
    }
    params_02.cParams.windowLog = in_stack_fffffffffffffebc;
    params_02.format = in_stack_fffffffffffffeb8;
    params_02.cParams.chainLog = (int)in_stack_fffffffffffffec0;
    params_02.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    auVar25 = in_stack_fffffffffffffec8._16_12_;
    auVar26 = in_stack_fffffffffffffec8._64_24_;
    auVar27 = in_stack_fffffffffffffec8._88_24_;
    params_02.cParams.searchLog = in_stack_fffffffffffffec8._0_4_;
    params_02.cParams.minMatch = in_stack_fffffffffffffec8._4_4_;
    params_02.cParams.targetLength = in_stack_fffffffffffffec8._8_4_;
    params_02.cParams.strategy = in_stack_fffffffffffffec8._12_4_;
    params_02.fParams.contentSizeFlag = auVar25._0_4_;
    params_02.fParams.checksumFlag = auVar25._4_4_;
    params_02.fParams.noDictIDFlag = auVar25._8_4_;
    params_02.compressionLevel = in_stack_fffffffffffffec8._28_4_;
    params_02.forceWindow = in_stack_fffffffffffffec8._32_4_;
    params_02.attachDictPref = in_stack_fffffffffffffec8._36_4_;
    params_02.nbWorkers = in_stack_fffffffffffffec8._40_4_;
    params_02._60_4_ = in_stack_fffffffffffffec8._44_4_;
    params_02.jobSize = in_stack_fffffffffffffec8._48_8_;
    params_02.overlapLog = in_stack_fffffffffffffec8._56_4_;
    params_02.rsyncable = in_stack_fffffffffffffec8._60_4_;
    params_02.ldmParams.enableLdm = auVar26._0_4_;
    params_02.ldmParams.hashLog = auVar26._4_4_;
    params_02.ldmParams.bucketSizeLog = auVar26._8_4_;
    params_02.ldmParams.minMatchLength = auVar26._12_4_;
    params_02.ldmParams.hashRateLog = auVar26._16_4_;
    params_02.ldmParams.windowLog = auVar26._20_4_;
    params_02.customMem.customAlloc = (ZSTD_allocFunction)auVar27._0_8_;
    params_02.customMem.customFree = (ZSTD_freeFunction)auVar27._8_8_;
    params_02.customMem.opaque = (void *)auVar27._16_8_;
    ZSTD_resetCCtx_internal(cctx,params_02,pledgedSrcSize,ZSTDcrp_continue,zbuff);
    uVar24 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
    uVar15 = (uint)uVar24;
    if ((cdict->matchState).window.dictLimit != uVar15) {
      (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
      if ((cctx->blockState).matchState.window.dictLimit < uVar15) {
        (cctx->blockState).matchState.window.nextSrc =
             (cctx->blockState).matchState.window.base + (uVar24 & 0xffffffff);
        (cctx->blockState).matchState.window.lowLimit = uVar15;
        (cctx->blockState).matchState.window.dictLimit = uVar15;
      }
      (cctx->blockState).matchState.loadedDictEnd = (cctx->blockState).matchState.window.dictLimit;
    }
    cctx->dictID = cdict->dictID;
    memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
  }
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    ZSTD_CCtx_params params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params.cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (cdict && cdict->dictContentSize>0) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    CHECK_F( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     ZSTDcrp_continue, zbuff) );
    {
        size_t const dictID = ZSTD_compress_insertDictionary(
                cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                &params, dict, dictSize, dictContentType, dtlm, cctx->entropyWorkspace);
        if (ZSTD_isError(dictID)) return dictID;
        assert(dictID <= (size_t)(U32)-1);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}